

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_ptr __thiscall mjs::parser::parse_block(parser *this,bool check_for_strict_mode)

{
  pointer *__return_storage_ptr__;
  byte in_DL;
  undefined7 in_register_00000031;
  parser *this_00;
  token local_88;
  undefined1 local_60 [8];
  statement_list l;
  bool check_for_strict_mode_local;
  parser *this_local;
  
  this_00 = (parser *)CONCAT71(in_register_00000031,check_for_strict_mode);
  __return_storage_ptr__ =
       &l.
        super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  expect((token *)__return_storage_ptr__,this_00,lbrace,"parse_block",0x314);
  token::~token((token *)__return_storage_ptr__);
  parse_statement_list((statement_list *)local_60,this_00,(bool)(in_DL & 1));
  expect(&local_88,this_00,rbrace,"parse_block",0x316);
  token::~token(&local_88);
  make_statement<mjs::block_statement,std::vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>,bool&>
            (this,(vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                   *)this_00,(bool *)local_60);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             *)local_60);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr parse_block(bool check_for_strict_mode = false) {
        EXPECT(token_type::lbrace);
        statement_list l = parse_statement_list(check_for_strict_mode);
        EXPECT(token_type::rbrace);
        return make_statement<block_statement>(std::move(l), strict_mode_);
    }